

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O2

void radau_compute(int n,double *x,double *w)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  void *pvVar5;
  ulong *puVar6;
  ulong *puVar7;
  ostream *poVar8;
  ulong *puVar9;
  ulong *puVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  double dVar15;
  double dVar16;
  ulong uVar17;
  
  if (0 < n) {
    uVar11 = (ulong)(uint)n;
    dVar15 = r8_epsilon();
    for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
      dVar16 = cos(((double)(int)uVar13 * 6.283185307179586) / (double)(n * 2 + -1));
      x[uVar13] = -dVar16;
    }
    pvVar5 = operator_new__(uVar11 * 8);
    uVar1 = n + 1;
    puVar6 = (ulong *)operator_new__((ulong)(uVar1 * n) << 3);
    iVar4 = (n + -1) * n;
    uVar3 = 0;
    do {
      for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
        *(double *)((long)pvVar5 + uVar13 * 8) = x[uVar13];
      }
      uVar17 = 0x3ff0000000000000;
      puVar7 = puVar6;
      uVar13 = (ulong)uVar1;
      while (bVar14 = uVar13 != 0, uVar13 = uVar13 - 1, bVar14) {
        *puVar7 = uVar17;
        uVar17 = uVar17 ^ 0x8000000000000000;
        puVar7 = puVar7 + uVar11;
      }
      for (uVar13 = 1; uVar11 != uVar13; uVar13 = uVar13 + 1) {
        puVar6[uVar13] = 0x3ff0000000000000;
      }
      for (uVar13 = 1; uVar11 != uVar13; uVar13 = uVar13 + 1) {
        puVar6[uVar11 + uVar13] = (ulong)x[uVar13];
      }
      puVar7 = puVar6 + uVar11 + 1;
      puVar9 = puVar6 + 1;
      puVar10 = puVar6 + uVar11 * 2 + 1;
      for (uVar13 = 2; uVar13 != uVar1; uVar13 = uVar13 + 1) {
        iVar2 = (int)uVar13;
        for (lVar12 = 0; uVar11 * 8 + -8 != lVar12; lVar12 = lVar12 + 8) {
          *(double *)((long)puVar10 + lVar12) =
               (*(double *)((long)x + lVar12 + 8) * (double)(iVar2 * 2 + -1) *
                *(double *)((long)puVar7 + lVar12) +
               *(double *)((long)puVar9 + lVar12) * (double)(1 - iVar2)) / (double)iVar2;
        }
        puVar10 = puVar10 + uVar11;
        puVar9 = puVar9 + uVar11;
        puVar7 = puVar7 + uVar11;
      }
      for (uVar13 = 1; uVar11 != uVar13; uVar13 = uVar13 + 1) {
        dVar16 = *(double *)((long)pvVar5 + uVar13 * 8);
        x[uVar13] = dVar16 - (((double)puVar6[(long)iVar4 + uVar13] +
                              (double)puVar6[(uint)(n * n) + uVar13]) * ((1.0 - dVar16) / (double)n)
                             ) / ((double)puVar6[(long)iVar4 + uVar13] -
                                 (double)puVar6[(uint)(n * n) + uVar13]);
      }
      dVar16 = 0.0;
      for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
        dVar16 = r8_max(dVar16,ABS(x[uVar13] - *(double *)((long)pvVar5 + uVar13 * 8)));
      }
    } while ((dVar15 * 100.0 < dVar16) && (bVar14 = uVar3 < 0x18, uVar3 = uVar3 + 1, bVar14));
    *w = 2.0 / (double)(n * n);
    for (uVar13 = 1; uVar11 != uVar13; uVar13 = uVar13 + 1) {
      dVar15 = (double)puVar6[(long)iVar4 + uVar13] * (double)n;
      w[uVar13] = (1.0 - x[uVar13]) / (dVar15 * dVar15);
    }
    operator_delete__(pvVar5);
    operator_delete__(puVar6);
    return;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"RADAU_COMPUTE - Fatal error!\n");
  poVar8 = std::operator<<((ostream *)&std::cerr,"  Illegal value of ORDER = ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,n);
  std::operator<<(poVar8,"\n");
  std::operator<<((ostream *)&std::cerr,"  ORDER must be at least 1.\n");
  exit(1);
}

Assistant:

void radau_compute ( int n, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    RADAU_COMPUTE computes a Radau quadrature rule.
//
//  Discussion:
//
//    The Radau rule is distinguished by the fact that the left endpoint
//    (-1) is always an abscissa.
//
//    The integral:
//
//      Integral ( -1 <= X <= 1 ) F(X) dX
//
//    The quadrature rule:
//
//      Sum ( 1 <= I <= NORDER ) WEIGHT(I) * F ( XTAB(I) )
//
//    The quadrature rule will integrate exactly all polynomials up to
//    X^(2*NORDER-2).
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    28 August 2007
//
//  Author:
//
//    Original MATLAB version by Greg von Winckel.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//    Claudio Canuto, Yousuff Hussaini, Alfio Quarteroni, Thomas Zang,
//    Spectral Methods in Fluid Dynamics,
//    Springer, 1993,
//    ISNB13: 978-3540522058,
//    LC: QA377.S676.
//
//    Francis Hildebrand,
//    Section 8.11,
//    Introduction to Numerical Analysis,
//    Dover, 1987,
//    ISBN13: 978-0486653631,
//    LC: QA300.H5.
//
//    Arthur Stroud, Don Secrest,
//    Gaussian Quadrature Formulas,
//    Prentice Hall, 1966,
//    LC: QA299.4G3S7.
//
//    Daniel Zwillinger, editor,
//    CRC Standard Mathematical Tables and Formulae,
//    30th Edition,
//    CRC Press, 1996,
//    ISBN: 0-8493-2479-3,
//    LC: QA47.M315.
//
//  Parameters:
//
//    Input, int N, the order.  N must be at least 1.
//
//    Output, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  int i;
  int iterate;
  int iterate_max = 25;
  int j;
  double *p;
  const double r8_pi = 3.141592653589793;
  double temp;
  double test;
  double tolerance;
  double *xold;

  if ( n < 1 )
  {
    std::cerr << "\n";
    std::cerr << "RADAU_COMPUTE - Fatal error!\n";
    std::cerr << "  Illegal value of ORDER = " << n << "\n";
    std::cerr << "  ORDER must be at least 1.\n";
    exit ( 1 );
  }

  tolerance = 100.0 * r8_epsilon ( );
//
//  Initial estimate for the abscissas is the Chebyshev-Gauss-Radau nodes.
//
  for ( i = 0; i < n; i++ )
  {
    x[i] = - cos ( 2.0 * r8_pi * double(         i ) 
                               / double( 2 * n - 1 ) );
  }
  xold = new double[n];
  p = new double[n*(n+1)];
  iterate = 0;

  do
  {
    for ( i = 0; i < n; i++ )
    {
      xold[i] = x[i];
    }

    temp = 1.0;
    for ( j = 0; j < n + 1; j++ )
    {
      p[0+j*n] = temp;
      temp = -temp;
    }

    for ( i = 1; i < n; i++ )
    {
      p[i+0*n] = 1.0;
    }
    for ( i = 1; i < n; i++ )
    {
      p[i+1*n] = x[i];
    }

    for ( j = 2; j <= n; j++ )
    {
      for ( i = 1; i < n; i++ )
      {
        p[i+j*n] = ( double( 2 * j - 1 ) * x[i] * p[i+(j-1)*n]     
                   + double(   - j + 1 ) *        p[i+(j-2)*n] ) 
                   / double(     j     );
      }
    }
    for ( i = 1; i < n; i++ )
    {
      x[i] = xold[i] - ( ( 1.0 - xold[i] ) / double( n ) ) 
        * ( p[i+(n-1)*n] + p[i+n*n] ) / ( p[i+(n-1)*n] - p[i+n*n] );
    }
    test = 0.0;
    for ( i = 0; i < n; i++ )
    {
      test = r8_max ( test, fabs ( x[i] - xold[i] ) );
    }
    iterate = iterate + 1;
  } while ( tolerance < test && iterate < iterate_max );

  w[0] = 2.0 / double( n * n );
  for ( i = 1; i < n; i++ )
  {
    w[i] = ( 1.0 - x[i] ) / pow ( double( n ) * p[i+(n-1)*n], 2 );
  }
  delete [] xold;
  delete [] p;

  return;
}